

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

void tb_phys_invalidate_mips
               (TCGContext_conflict3 *tcg_ctx,TranslationBlock_conflict *tb,tb_page_addr_t page_addr
               )

{
  uc_struct_conflict4 *uc;
  
  if ((page_addr == 0xffffffffffffffff) && (tb->page_addr[0] != 0xffffffffffffffff)) {
    page_lock_pair(tcg_ctx->uc,(PageDesc **)0x0,tb->page_addr[0],(PageDesc **)0x0,tb->page_addr[1],0
                  );
    do_tb_phys_invalidate(tcg_ctx,tb,true);
    uc = tcg_ctx->uc;
    page_find(uc,tb->page_addr[0] >> 0xc);
    if (tb->page_addr[1] == 0xffffffffffffffff) {
      return;
    }
    page_find(uc,tb->page_addr[1] >> 0xc);
    return;
  }
  do_tb_phys_invalidate(tcg_ctx,tb,false);
  return;
}

Assistant:

void tb_phys_invalidate(TCGContext *tcg_ctx, TranslationBlock *tb, tb_page_addr_t page_addr)
{
    if (page_addr == -1 && tb->page_addr[0] != -1) {
        page_lock_tb(tcg_ctx->uc, tb);
        do_tb_phys_invalidate(tcg_ctx, tb, true);
        page_unlock_tb(tcg_ctx->uc, tb);
    } else {
        do_tb_phys_invalidate(tcg_ctx, tb, false);
    }
}